

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverBB.cpp
# Opt level: O3

void __thiscall chrono::ChSolverBB::ArchiveOUT(ChSolverBB *this)

{
  ChArchiveOut *in_RSI;
  
  ArchiveOUT((ChSolverBB *)
             &this[-1].super_ChIterativeSolverVI.dlambda_history.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,in_RSI);
  return;
}

Assistant:

void ChSolverBB::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChSolverBB>();
    // serialize parent class
    ChIterativeSolverVI::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(n_armijo);
    marchive << CHNVP(max_armijo_backtrace);
    marchive << CHNVP(m_use_precond);
}